

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void ggml_print_backtrace(void)

{
  uint uVar1;
  __pid_t __pid;
  undefined4 uVar2;
  char *pcVar3;
  int wstatus;
  char attach [32];
  void *trace [100];
  
  pcVar3 = getenv("GGML_NO_BACKTRACE");
  if (pcVar3 == (char *)0x0) {
    uVar1 = getpid();
    snprintf(attach,0x20,"attach %d",(ulong)uVar1);
    __pid = fork();
    if (__pid == 0) {
      execlp("gdb","gdb","--batch","-ex","set style enabled on","-ex",attach,"-ex",
             "bt -frame-info source-and-location","-ex","detach","-ex","quit",0);
      execlp("lldb","lldb","--batch","-o","bt","-o","quit","-p",attach,0);
      exit(1);
    }
    waitpid(__pid,&wstatus,0);
    if ((wstatus & 0xff7fU) == 0x100) {
      uVar2 = backtrace(trace,100);
      backtrace_symbols_fd(trace,uVar2,2);
    }
  }
  return;
}

Assistant:

static void ggml_print_backtrace(void) {
    const char * GGML_NO_BACKTRACE = getenv("GGML_NO_BACKTRACE");
    if (GGML_NO_BACKTRACE) {
        return;
    }
    char attach[32];
    snprintf(attach, sizeof(attach), "attach %d", getpid());
    int pid = fork();
    if (pid == 0) {
        // try gdb
        execlp("gdb", "gdb", "--batch",
            "-ex", "set style enabled on",
            "-ex", attach,
            "-ex", "bt -frame-info source-and-location",
            "-ex", "detach",
            "-ex", "quit",
            (char *) NULL);
        // try lldb
        execlp("lldb", "lldb", "--batch",
            "-o", "bt",
            "-o", "quit",
            "-p", attach,
            (char *) NULL);
        exit(EXIT_FAILURE);
    } else {
        int wstatus;
        waitpid(pid, &wstatus, 0);
        if (WIFEXITED(wstatus)) {
            if (WEXITSTATUS(wstatus) == EXIT_FAILURE) {
                // gdb failed, fallback to backtrace_symbols
                ggml_print_backtrace_symbols();
            }
        }
    }
}